

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

ssize_t __thiscall
fmt::v6::internal::
arg_formatter_base<fmt::v6::buffer_range<wchar_t>,_fmt::v6::internal::error_handler>::write
          (arg_formatter_base<fmt::v6::buffer_range<wchar_t>,_fmt::v6::internal::error_handler>
           *this,int __fd,void *__buf,size_t __n)

{
  basic_string_view<wchar_t> s;
  char *message;
  size_t count;
  ssize_t extraout_RAX;
  ssize_t sVar1;
  undefined4 in_register_00000034;
  basic_string_view<wchar_t> sv;
  size_t length;
  format_specs *in_stack_ffffffffffffffc8;
  basic_writer<fmt::v6::buffer_range<wchar_t>_> *in_stack_ffffffffffffffd0;
  
  if ((wchar_t *)CONCAT44(in_register_00000034,__fd) == (wchar_t *)0x0) {
    message = (char *)__cxa_allocate_exception(0x10);
    format_error::format_error((format_error *)this,message);
    __cxa_throw(message,&format_error::typeinfo,format_error::~format_error);
  }
  count = std::char_traits<wchar_t>::length((char_type_conflict *)0x23d5bf);
  basic_string_view<wchar_t>::basic_string_view
            ((basic_string_view<wchar_t> *)&stack0xffffffffffffffc8,
             (wchar_t *)CONCAT44(in_register_00000034,__fd),count);
  if (this->specs_ == (format_specs *)0x0) {
    sVar1 = basic_writer<fmt::v6::buffer_range<wchar_t>_>::write
                      (&this->writer_,(int)in_stack_ffffffffffffffc8,in_stack_ffffffffffffffd0,__n);
  }
  else {
    s.size_ = (size_t)in_stack_ffffffffffffffd0;
    s.data_ = &in_stack_ffffffffffffffc8->width;
    basic_writer<fmt::v6::buffer_range<wchar_t>_>::write<wchar_t>
              (in_stack_ffffffffffffffd0,s,in_stack_ffffffffffffffc8);
    sVar1 = extraout_RAX;
  }
  return sVar1;
}

Assistant:

void write(const char_type* value) {
    if (!value) {
      FMT_THROW(format_error("string pointer is null"));
    } else {
      auto length = std::char_traits<char_type>::length(value);
      basic_string_view<char_type> sv(value, length);
      specs_ ? writer_.write(sv, *specs_) : writer_.write(sv);
    }
  }